

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O1

_Bool duckdb_je_hpdata_purge_next
                (hpdata_t *hpdata,hpdata_purge_state_t *purge_state,void **r_purge_addr,
                size_t *r_purge_size)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long in_R10;
  ulong uVar5;
  _Bool _Var6;
  
  uVar2 = purge_state->next_purge_search_begin;
  if (uVar2 == 0x200) {
    _Var6 = false;
  }
  else {
    uVar3 = uVar2 >> 6;
    uVar2 = (purge_state->to_purge[uVar3] >> ((byte)uVar2 & 0x3f)) << ((byte)uVar2 & 0x3f);
    while (uVar2 == 0) {
      if (uVar3 == 7) {
        uVar4 = 0x200;
        goto LAB_0119ad3f;
      }
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
      uVar2 = purge_state->to_purge[lVar1];
    }
    uVar4 = 0;
    if (uVar2 != 0) {
      for (; (uVar2 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    uVar4 = uVar3 << 6 | uVar4;
LAB_0119ad3f:
    _Var6 = uVar4 != 0x200;
    if (_Var6) {
      uVar2 = uVar4 >> 6;
      uVar3 = (~purge_state->to_purge[uVar2] >> ((byte)uVar4 & 0x3f)) << ((byte)uVar4 & 0x3f);
      if (uVar3 == 0) {
        do {
          if (uVar2 == 7) {
            uVar5 = 0x200;
            goto LAB_0119ada8;
          }
          lVar1 = uVar2 + 1;
          uVar2 = uVar2 + 1;
        } while (purge_state->to_purge[lVar1] == 0xffffffffffffffff);
        uVar3 = ~purge_state->to_purge[lVar1];
      }
      uVar5 = 0;
      if (uVar3 != 0) {
        for (; (uVar3 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar5 = uVar2 << 6 | uVar5;
      if (0x1ff < uVar5) {
        uVar5 = 0x200;
      }
LAB_0119ada8:
      in_R10 = uVar5 - uVar4;
    }
    if (uVar4 != 0x200) {
      *r_purge_addr = (void *)(uVar4 * 0x1000 + (long)hpdata->h_address);
      *r_purge_size = in_R10 << 0xc;
      purge_state->next_purge_search_begin = in_R10 + uVar4;
      purge_state->npurged = purge_state->npurged + in_R10;
      return _Var6;
    }
  }
  return _Var6;
}

Assistant:

bool
hpdata_purge_next(hpdata_t *hpdata, hpdata_purge_state_t *purge_state,
    void **r_purge_addr, size_t *r_purge_size) {
	/*
	 * Note that we don't have a consistency check here; we're accessing
	 * hpdata without synchronization, and therefore have no right to expect
	 * a consistent state.
	 */
	assert(!hpdata_alloc_allowed_get(hpdata));

	if (purge_state->next_purge_search_begin == HUGEPAGE_PAGES) {
		return false;
	}
	size_t purge_begin;
	size_t purge_len;
	bool found_range = fb_srange_iter(purge_state->to_purge, HUGEPAGE_PAGES,
	    purge_state->next_purge_search_begin, &purge_begin, &purge_len);
	if (!found_range) {
		return false;
	}

	*r_purge_addr = (void *)(
	    (byte_t *)hpdata_addr_get(hpdata) + purge_begin * PAGE);
	*r_purge_size = purge_len * PAGE;

	purge_state->next_purge_search_begin = purge_begin + purge_len;
	purge_state->npurged += purge_len;
	assert(purge_state->npurged <= HUGEPAGE_PAGES);

	return true;
}